

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void stressing_single_thread(void)

{
  ostream *this;
  int i;
  undefined4 in_stack_ffffffffffffeff8;
  int in_stack_ffffffffffffeffc;
  Logger *this_00;
  Logger *in_stack_fffffffffffff040;
  int local_4;
  
  this = std::operator<<((ostream *)&std::cout,
                         "---------------stressing test single thread----------------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_4 = 0; local_4 < 1000; local_4 = local_4 + 1) {
    this_00 = (Logger *)&stack0xfffffffffffff020;
    Logger::Logger(this_00,(char *)CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),0);
    Logger::stream(this_00);
    LogStream::operator<<((LogStream *)this_00,in_stack_ffffffffffffeffc);
    Logger::~Logger(in_stack_fffffffffffff040);
  }
  return;
}

Assistant:

void stressing_single_thread(){
    // 100000 lines
    cout<<"---------------stressing test single thread----------------"<<endl;
    for (int i=0; i<1000; ++i) {
        LOG<<i;
    }
}